

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O0

iterator __thiscall FIX::FieldMap::findPositionFor(FieldMap *this,int tag)

{
  bool bVar1;
  int iVar2;
  __normal_iterator<FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  _Var3;
  sorter local_40;
  __normal_iterator<FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  local_38;
  __normal_iterator<FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  local_30;
  reference local_28;
  FieldBase *lastField;
  FieldMap *pFStack_18;
  int tag_local;
  FieldMap *this_local;
  
  lastField._4_4_ = tag;
  pFStack_18 = this;
  bVar1 = std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::empty(&this->m_fields);
  if (bVar1) {
    this_local = (FieldMap *)
                 std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::end(&this->m_fields);
  }
  else {
    local_28 = std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::back(&this->m_fields);
    iVar2 = FieldBase::getTag(local_28);
    bVar1 = message_order::operator()(&this->m_order,iVar2,lastField._4_4_);
    if ((!bVar1) && (iVar2 = FieldBase::getTag(local_28), iVar2 != lastField._4_4_)) {
      local_30._M_current =
           (FieldBase *)
           std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::begin(&this->m_fields);
      local_38._M_current =
           (FieldBase *)
           std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::end(&this->m_fields);
      sorter::sorter(&local_40,&this->m_order);
      _Var3 = std::
              upper_bound<__gnu_cxx::__normal_iterator<FIX::FieldBase*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>,int,FIX::FieldMap::sorter>
                        (local_30,local_38,(int *)((long)&lastField + 4),local_40);
      return (iterator)_Var3._M_current;
    }
    this_local = (FieldMap *)
                 std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::end(&this->m_fields);
  }
  return (iterator)(FieldBase *)this_local;
}

Assistant:

Fields::iterator findPositionFor(int tag) {
    if (m_fields.empty()) {
      return m_fields.end();
    }

    const FieldBase &lastField = m_fields.back();
    if (m_order(lastField.getTag(), tag) || lastField.getTag() == tag) {
      return m_fields.end();
    }

    return std::upper_bound(m_fields.begin(), m_fields.end(), tag, sorter(m_order));
  }